

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

string * from_errno_abi_cxx11_(void)

{
  int *piVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"syserror{code = ",&local_b1);
  piVar1 = __errno_location();
  std::__cxx11::to_string(&local_b0,*piVar1);
  std::operator+(&local_70,&local_90,&local_b0);
  std::operator+(&local_50,&local_70,", msg = ");
  __rhs = strerror(*piVar1);
  std::operator+(&local_30,&local_50,__rhs);
  std::operator+(in_RDI,&local_30,"}");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return in_RDI;
}

Assistant:

std::string from_errno() {
  std::string out = std::string("syserror{code = ") + std::to_string(errno) + ", msg = " + strerror(errno) + "}";
  return out;
}